

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall
xmrig::MinerPrivate::getMiner(MinerPrivate *this,Value *reply,Document *doc,int param_3)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t sVar1;
  StringRefType local_c0;
  Cpu local_b0 [16];
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_40.s = "version";
  local_40.length = 7;
  local_50.s = "5.0.0";
  local_50.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(reply,&local_40,&local_50,allocator);
  local_60.s = "kind";
  local_60.length = 4;
  local_70.s = "miner";
  local_70.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(reply,&local_60,&local_70,allocator);
  local_80.s = "ua";
  local_80.length = 2;
  local_90.s = Platform::m_userAgent;
  sVar1 = strlen(Platform::m_userAgent);
  local_90.length = (SizeType)sVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(reply,&local_80,&local_90,allocator);
  local_a0.s = "cpu";
  local_a0.length = 3;
  Cpu::toJSON(local_b0,doc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(reply,&local_a0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_b0,allocator);
  local_c0.s = "paused";
  local_c0.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(reply,&local_c0,(bool)(this->enabled ^ 1),allocator);
  return;
}

Assistant:

void getMiner(rapidjson::Value &reply, rapidjson::Document &doc, int) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        reply.AddMember("version",      APP_VERSION, allocator);
        reply.AddMember("kind",         APP_KIND, allocator);
        reply.AddMember("ua",           StringRef(Platform::userAgent()), allocator);
        reply.AddMember("cpu",          Cpu::toJSON(doc), allocator);
        reply.AddMember("paused",       !enabled, allocator);
    }